

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall FListMenuItemPlayerDisplay::Drawer(FListMenuItemPlayerDisplay *this,bool selected)

{
  ushort uVar1;
  DFrameBuffer *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *name;
  spritedef_t *psVar6;
  AActor *pAVar7;
  FTexture *pFVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  FRemapTable *pFVar13;
  undefined4 uVar14;
  FRemapTable *local_78;
  FRemapTable *trans;
  FTexture *tex_1;
  DVector2 Scale;
  spriteframe_t *sprframe;
  int y;
  int x;
  FTexture *tex;
  FTextureID texid;
  FString local_20;
  FString portrait;
  bool selected_local;
  FListMenuItemPlayerDisplay *this_local;
  
  portrait.Chars._7_1_ = selected;
  if ((this->mMode == '\0') && (bVar2 = UpdatePlayerClass(this), !bVar2)) {
    return;
  }
  FString::FString(&local_20,&this->mPlayerClass->Type->Portrait);
  bVar2 = FString::IsNotEmpty(&local_20);
  if ((bVar2) && ((this->mNoportrait & 1U) == 0)) {
    name = FString::operator_cast_to_char_(&local_20);
    tex._0_4_ = FTextureManager::CheckForTexture(&TexMan,name,8,1);
    bVar2 = FTextureID::isValid((FTextureID *)&tex);
    if ((bVar2) &&
       (pFVar8 = FTextureManager::operator()(&TexMan,tex._0_4_,false), pFVar8 != (FTexture *)0x0)) {
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar8,(double)(this->super_FListMenuItem).mXpos,
                 (double)(this->super_FListMenuItem).mYpos,0x40001390,1,0);
      goto LAB_003d5e8a;
    }
  }
  iVar3 = ((this->super_FListMenuItem).mXpos + -0xa0) * CleanXfac;
  iVar4 = DCanvas::GetWidth((DCanvas *)screen);
  iVar3 = iVar3 + (iVar4 >> 1);
  iVar5 = ((this->super_FListMenuItem).mYpos + -100) * CleanYfac;
  iVar4 = DCanvas::GetHeight((DCanvas *)screen);
  iVar5 = iVar5 + (iVar4 >> 1);
  pFVar13 = &this->mRemap;
  DCanvas::DrawTexture
            ((DCanvas *)screen,this->mBackdrop,(double)iVar3,(double)(iVar5 + -1),0x40001389,
             (ulong)(uint)(CleanXfac * 0x48),0x4000138a,(ulong)(uint)(CleanYfac * 0x50),0x4000138e,
             pFVar13,0x400013a5,1,0);
  uVar14 = (undefined4)((ulong)pFVar13 >> 0x20);
  V_DrawFrame(iVar3,iVar5,CleanXfac * 0x48,CleanYfac * 0x50 + -1);
  Scale.Y = 0.0;
  TVector2<double>::TVector2((TVector2<double> *)&tex_1);
  if (this->mPlayerState != (FState *)0x0) {
    if (this->mSkin == 0) {
      psVar6 = TArray<spritedef_t,_spritedef_t>::operator[]
                         (&sprites,(long)this->mPlayerState->sprite);
      uVar1 = psVar6->spriteframes;
      iVar4 = FState::GetFrame(this->mPlayerState);
      Scale.Y = (double)TArray<spriteframe_t,_spriteframe_t>::operator[]
                                  (&SpriteFrames,(long)(int)((uint)uVar1 + iVar4));
      pAVar7 = GetDefaultByType((PClass *)this->mPlayerClass->Type);
      TVector2<double>::operator=((TVector2<double> *)&tex_1,&pAVar7->Scale);
    }
    else {
      psVar6 = TArray<spritedef_t,_spritedef_t>::operator[]
                         (&sprites,(long)skins[this->mSkin].sprite);
      uVar1 = psVar6->spriteframes;
      iVar4 = FState::GetFrame(this->mPlayerState);
      Scale.Y = (double)TArray<spriteframe_t,_spriteframe_t>::operator[]
                                  (&SpriteFrames,(long)(int)((uint)uVar1 + iVar4));
      TVector2<double>::operator=((TVector2<double> *)&tex_1,&skins[this->mSkin].Scale);
    }
  }
  if (((Scale.Y != 0.0) &&
      (pFVar8 = FTextureManager::operator()
                          (&TexMan,(FTextureID)
                                   *(int *)((long)Scale.Y + 8 + (ulong)this->mRotation * 4),false),
      pFVar8 != (FTexture *)0x0)) && (pFVar8->UseType != '\r')) {
    local_78 = (FRemapTable *)0x0;
    if (this->mTranslate != '\0') {
      local_78 = TArray<FRemapTablePtr,_FRemapTable_*>::operator()
                           (&translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>,8);
    }
    this_00 = screen;
    iVar4 = CleanXfac * 0x24;
    iVar9 = CleanYfac * 0x47;
    dVar10 = FTexture::GetScaledWidthDouble(pFVar8);
    dVar12 = (double)CleanXfac;
    dVar11 = FTexture::GetScaledHeightDouble(pFVar8);
    DCanvas::DrawTexture
              ((DCanvas *)this_00,pFVar8,(double)(iVar3 + iVar4),(double)(iVar5 + iVar9),0x400013af,
               dVar10 * dVar12 * (double)tex_1,dVar11 * (double)CleanYfac * Scale.X,0x400013b0,
               0x4000138e,local_78,0x40001395,
               CONCAT44(uVar14,(uint)*(ushort *)((long)Scale.Y + 0x48) &
                               1 << (this->mRotation & 0x1f)),0);
  }
LAB_003d5e8a:
  FString::~FString(&local_20);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Drawer(bool selected)
{
	if (mMode == 0 && !UpdatePlayerClass())
	{
		return;
	}

	FString portrait = mPlayerClass->Type->Portrait;

	if (portrait.IsNotEmpty() && !mNoportrait)
	{
		FTextureID texid = TexMan.CheckForTexture(portrait, FTexture::TEX_MiscPatch);
		if (texid.isValid())
		{
			FTexture *tex = TexMan(texid);
			if (tex != NULL)
			{
				screen->DrawTexture (tex, mXpos, mYpos, DTA_Clean, true, TAG_DONE);
				return;
			}
		}
	}
	int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
	int y = (mYpos - 100) * CleanYfac + (SCREENHEIGHT>>1);

	screen->DrawTexture (mBackdrop, x, y - 1,
		DTA_DestWidth, 72 * CleanXfac,
		DTA_DestHeight, 80 * CleanYfac,
		DTA_Translation, &mRemap,
		DTA_Masked, true,
		TAG_DONE);

	V_DrawFrame (x, y, 72*CleanXfac, 80*CleanYfac-1);

	spriteframe_t *sprframe = NULL;
	DVector2 Scale;

	if (mPlayerState != NULL)
	{
		if (mSkin == 0)
		{
			sprframe = &SpriteFrames[sprites[mPlayerState->sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = GetDefaultByType(mPlayerClass->Type)->Scale;
		}
		else
		{
			sprframe = &SpriteFrames[sprites[skins[mSkin].sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = skins[mSkin].Scale;
		}
	}

	if (sprframe != NULL)
	{
		FTexture *tex = TexMan(sprframe->Texture[mRotation]);
		if (tex != NULL && tex->UseType != FTexture::TEX_Null)
		{
			FRemapTable *trans = NULL;
			if (mTranslate) trans = translationtables[TRANSLATION_Players](MAXPLAYERS);
			screen->DrawTexture (tex,
				x + 36*CleanXfac, y + 71*CleanYfac,
				DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * Scale.X,
				DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * Scale.Y,
				DTA_Translation, trans,
				DTA_FlipX, sprframe->Flip & (1 << mRotation),
				TAG_DONE);
		}
	}
}